

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O2

bool __thiscall ON_Brep::IsValidEdgeTopology(ON_Brep *this,int edge_index,ON_TextLog *text_log)

{
  ON_BrepEdge *this_00;
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  ON_BrepEdge *pOVar5;
  ON_BrepVertex *pOVar6;
  ON_BrepTrim *pOVar7;
  int *piVar8;
  bool bVar9;
  int iVar10;
  ON_Curve *pOVar11;
  ON_Curve *pOVar12;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  ON_Interval proxy_sub_dom;
  ON_Interval edge_dom;
  ON_Interval c3_dom;
  
  uVar15 = (ulong)(uint)edge_index;
  uVar3 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
  if (edge_index < 0 || (int)uVar3 <= edge_index) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    pcVar16 = "brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n";
LAB_004301c6:
    ON_TextLog::Print(text_log,pcVar16,uVar15,(ulong)uVar3);
    return false;
  }
  pOVar5 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
  this_00 = pOVar5 + uVar15;
  if (pOVar5[uVar15].m_edge_index != edge_index) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
    ON_TextLog::PushIndent(text_log);
    uVar3 = this_00->m_edge_index;
    pcVar16 = "edge.m_edge_index = %d (should be %d).\n";
LAB_00430209:
    ON_TextLog::Print(text_log,pcVar16,(ulong)uVar3,uVar15);
    goto LAB_004302f9;
  }
  if (this_00->m_brep == this) {
    iVar10 = (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
               _vptr_ON_Object[6])(this_00,text_log);
    if ((char)iVar10 != '\0') {
      uVar3 = this_00->m_c3i;
      lVar17 = (long)(int)uVar3;
      if ((lVar17 < 0) || ((this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count <= (int)uVar3)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
        ON_TextLog::PushIndent(text_log);
        uVar3 = this_00->m_c3i;
        uVar15 = (ulong)(uint)(this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count;
        pcVar16 = "edge.m_c3i = %d (should be >=0 and <%d=m_C3.Count()\n";
        goto LAB_00430209;
      }
      if ((this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar17] == (ON_Curve *)0x0) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"ON_Brep.m_E[%d].m_c3i = %d, but m_C3[%d] is nullptr.\n",uVar15,
                          (ulong)uVar3,(ulong)uVar3);
        return false;
      }
      pOVar11 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
      if (pOVar11 == (ON_Curve *)0x0) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        pcVar16 = "brep.m_E[%d].m_c3i = %d, but edge.ProxyCurve() is nullptr.\n";
        goto LAB_004301c6;
      }
      pOVar11 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar17];
      pOVar12 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
      if (pOVar11 != pOVar12) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"m_E[%d].m_c3i=%d, m_C3[%d] != m_E[%d].ProxyCurve()\n",uVar15,
                          (ulong)uVar3,(ulong)uVar3,uVar15);
        goto LAB_004302f9;
      }
      proxy_sub_dom = ON_CurveProxy::ProxyCurveDomain(&this_00->super_ON_CurveProxy);
      dVar20 = proxy_sub_dom.m_t[1];
      bVar9 = ON_Interval::IsIncreasing(&proxy_sub_dom);
      if (!bVar9) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
        ON_TextLog::PushIndent(text_log);
        pdVar13 = ON_Interval::operator[](&proxy_sub_dom,0);
        dVar20 = *pdVar13;
        pdVar13 = ON_Interval::operator[](&proxy_sub_dom,1);
        ON_TextLog::Print(text_log,"m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n",dVar20
                          ,*pdVar13,uVar15);
        goto LAB_004302f9;
      }
      (*((this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar17]->super_ON_Geometry).
        super_ON_Object._vptr_ON_Object[0x25])();
      c3_dom.m_t[1] = dVar20;
      bVar9 = ON_Interval::Includes(&c3_dom,&proxy_sub_dom,false);
      if (!bVar9) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
        ON_TextLog::PushIndent(text_log);
        pdVar13 = ON_Interval::operator[](&c3_dom,0);
        dVar20 = *pdVar13;
        pdVar13 = ON_Interval::operator[](&c3_dom,1);
        dVar1 = *pdVar13;
        pdVar13 = ON_Interval::operator[](&proxy_sub_dom,0);
        dVar2 = *pdVar13;
        pdVar13 = ON_Interval::operator[](&proxy_sub_dom,1);
        ON_TextLog::Print(text_log,
                          "m_C3[%d].Domain() = (%g,%g) does not inlclude m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n"
                          ,dVar20,dVar1,dVar2,*pdVar13,(ulong)uVar3,uVar15);
        goto LAB_004302f9;
      }
      (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[0x25])(this_00);
      edge_dom.m_t[1] = dVar20;
      bVar9 = ON_Interval::IsIncreasing(&edge_dom);
      if (!bVar9) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"brep.m_E[%d] trim is not valid.\n",uVar15);
        ON_TextLog::PushIndent(text_log);
        pdVar13 = ON_Interval::operator[](&edge_dom,0);
        dVar20 = *pdVar13;
        pdVar13 = ON_Interval::operator[](&edge_dom,1);
        ON_TextLog::Print(text_log,"m_E[%d].Domain() = (%g,%g) is not increasing\n",dVar20,*pdVar13,
                          uVar15);
        goto LAB_0043064f;
      }
      uVar3 = this_00->m_vi[0];
      if (((int)uVar3 < 0) ||
         (uVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
                  .m_count, (int)uVar4 <= (int)uVar3)) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
        ON_TextLog::PushIndent(text_log);
        uVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
                m_count;
        pcVar16 = "edge.m_vi[0]=%d (should be >=0 and <%d=m_V.Count()\n";
LAB_00430642:
        uVar18 = (ulong)uVar3;
        uVar15 = (ulong)uVar4;
      }
      else {
        uVar3 = this_00->m_vi[1];
        if (uVar4 <= uVar3 || (int)uVar3 < 0) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
          ON_TextLog::PushIndent(text_log);
          uVar4 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
                  .m_count;
          pcVar16 = "edge.m_vi[1]=%d (should be >=0 and <%d=m_V.Count()\n";
          goto LAB_00430642;
        }
        pOVar6 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
                 m_a;
        for (uVar18 = 0; uVar18 != 2; uVar18 = uVar18 + 1) {
          iVar10 = this_00->m_vi[uVar18];
          if (iVar10 != pOVar6[iVar10].m_vertex_index) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
            ON_TextLog::PushIndent(text_log);
            uVar15 = (ulong)(uint)this_00->m_vi[uVar18];
            pcVar16 = "edge.m_vi[%d]=%d is a deleted vertex\n";
            uVar18 = uVar18 & 0xffffffff;
            goto LAB_00430648;
          }
          lVar17 = 0;
          bVar9 = false;
          while ((lVar17 < pOVar6[iVar10].m_ei.m_count && (!bVar9))) {
            piVar8 = pOVar6[iVar10].m_ei.m_a + lVar17;
            lVar17 = lVar17 + 1;
            bVar9 = *piVar8 == edge_index;
          }
          if (!bVar9) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
            ON_TextLog::PushIndent(text_log);
            uVar3 = this_00->m_vi[uVar18];
            uVar19 = (ulong)uVar3;
            pcVar16 = "edge.m_vi[%d]=%d but edge is not referenced in m_V[%d].m_ei[]\n";
LAB_004307cd:
            ON_TextLog::Print(text_log,pcVar16,uVar18 & 0xffffffff,uVar19,(ulong)uVar3);
            goto LAB_0043064f;
          }
        }
        uVar14 = (ulong)(this_00->m_ti).m_count;
        if ((long)uVar14 < 0) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,"edge.m_ti.Count() < 0\n");
          goto LAB_0043064f;
        }
        pOVar7 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        uVar19 = 0;
        while( true ) {
          if (uVar19 == uVar14) {
            return true;
          }
          piVar8 = (this_00->m_ti).m_a;
          uVar3 = piVar8[uVar19];
          lVar17 = (long)(int)uVar3;
          if ((lVar17 < 0) ||
             ((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count
              <= (int)uVar3)) break;
          if (pOVar7[lVar17].m_trim_index != uVar3) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
            ON_TextLog::PushIndent(text_log);
            pcVar16 = "edge.m_ti[%d]=%d is a deleted trim\n";
            goto LAB_00430873;
          }
          for (uVar18 = 0; uVar19 != uVar18; uVar18 = uVar18 + 1) {
            if (piVar8[uVar18] == uVar3) {
              if (text_log == (ON_TextLog *)0x0) {
                return false;
              }
              ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
              ON_TextLog::PushIndent(text_log);
              pcVar16 = "edge.m_ti[%d]=edge.m_ti[%d]=%d (a trim should be referenced once).\n";
              uVar19 = uVar19 & 0xffffffff;
              goto LAB_004307cd;
            }
          }
          if (pOVar7[lVar17].m_ei != edge_index) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,"edge.m_ti[%d]=%d but brep.m_T[%d].m_ei=%d\n",
                              uVar19 & 0xffffffff,(ulong)uVar3,(ulong)uVar3,
                              (ulong)(uint)pOVar7[lVar17].m_ei);
            goto LAB_0043064f;
          }
          uVar19 = uVar19 + 1;
        }
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
        ON_TextLog::PushIndent(text_log);
        pcVar16 = "edge.m_ti[%d]=%d (should be >=0 and <%d=m_T.Count())\n";
LAB_00430873:
        uVar18 = uVar19 & 0xffffffff;
        uVar15 = (ulong)uVar3;
      }
LAB_00430648:
      ON_TextLog::Print(text_log,pcVar16,uVar18,uVar15);
LAB_0043064f:
      ON_TextLog::PopIndent(text_log);
      return false;
    }
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
    ON_TextLog::PushIndent(text_log);
    pcVar16 = "edge is not a valid.\n";
  }
  else {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",uVar15);
    ON_TextLog::PushIndent(text_log);
    pcVar16 = "edge.m_brep does not point to parent brep\n";
  }
  ON_TextLog::Print(text_log,pcVar16);
LAB_004302f9:
  ON_TextLog::PopIndent(text_log);
  return false;
}

Assistant:

bool
ON_Brep::IsValidEdgeTopology( int edge_index, ON_TextLog* text_log ) const
{
  if ( edge_index < 0 || edge_index >= m_E.Count() )
  {
    if ( text_log )
      text_log->Print("brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n",
                      edge_index, m_E.Count());
    return false;
  }
  const ON_BrepEdge& edge = m_E[edge_index];
  if ( edge.m_edge_index != edge_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_edge_index = %d (should be %d).\n",
                       edge.m_edge_index, edge_index );
      text_log->PopIndent();
    }
    return false;
  }
  if ( edge.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_brep does not point to parent brep\n");
      text_log->PopIndent();
    }
    return false;
  }

  if ( !edge.IsValid(text_log) )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge is not a valid.\n");
      text_log->PopIndent();
    }
    return false;
  }

  // This checks to make sure that m_C3[] and the edge's proxy information is valid.
  // This isn't exactly "topology", but if this stuff isn't set right, then the
  // "geometry" checks might crash.

  const int c3i = edge.m_c3i;
  if ( c3i < 0 || c3i >= m_C3.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_c3i = %d (should be >=0 and <%d=m_C3.Count()\n",
                      edge.m_c3i,m_C3.Count() );
      text_log->PopIndent();
    }
    return false;
  }
  
  if ( 0 == m_C3[c3i] )
  {
    if ( text_log )
      text_log->Print("ON_Brep.m_E[%d].m_c3i = %d, but m_C3[%d] is nullptr.\n",edge_index,c3i,c3i);
    return false;
  }

  if ( 0 == edge.ProxyCurve() )
  {
    if ( text_log )
      text_log->Print("brep.m_E[%d].m_c3i = %d, but edge.ProxyCurve() is nullptr.\n",edge_index,c3i);
    return false;
  }

  if ( m_C3[c3i] != edge.ProxyCurve() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_E[%d].m_c3i=%d, m_C3[%d] != m_E[%d].ProxyCurve()\n",edge_index,c3i,c3i,edge_index);
      text_log->PopIndent();
    }
    return false;
  }

  ON_Interval proxy_sub_dom = edge.ProxyCurveDomain();
  if ( !proxy_sub_dom.IsIncreasing() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n",edge_index,proxy_sub_dom[0],proxy_sub_dom[1]);
      text_log->PopIndent();
    }
    return false;
  }

  ON_Interval c3_dom = m_C3[c3i]->Domain();
  if ( !c3_dom.Includes(proxy_sub_dom) )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_C3[%d].Domain() = (%g,%g) does not inlclude m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n",
                      c3i,c3_dom[0],c3_dom[1],edge_index,proxy_sub_dom[0],proxy_sub_dom[1]);
      text_log->PopIndent();
    }
    return false;
  }

  ON_Interval edge_dom = edge.Domain();
  if ( !edge_dom.IsIncreasing() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] trim is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_E[%d].Domain() = (%g,%g) is not increasing\n",edge_index,edge_dom[0],edge_dom[1]);
      text_log->PopIndent();
    }
    return false;
  }



  const int vi0 = edge.m_vi[0];
  const int vi1 = edge.m_vi[1];
  if ( vi0 < 0 || vi0 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_vi[0]=%d (should be >=0 and <%d=m_V.Count()\n",
                       vi0, m_V.Count() );
      text_log->PopIndent();
    }
    return false;
  }
  if ( vi1 < 0 || vi1 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_vi[1]=%d (should be >=0 and <%d=m_V.Count()\n",
                       vi1, m_V.Count() );
      text_log->PopIndent();
    }
    return false;
  }
  int evi;
  for ( evi = 0; evi < 2; evi++ ) 
  {
    const ON_BrepVertex& vertex = m_V[edge.m_vi[evi]];

    if ( edge.m_vi[evi] != vertex.m_vertex_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_vi[%d]=%d is a deleted vertex\n",
                         evi,edge.m_vi[evi] );
        text_log->PopIndent();
      }
      return false;
    }


    const int vertex_edge_count = vertex.m_ei.Count();
    bool bFoundIt = false;
    int vei;
    for ( vei = 0; vei < vertex_edge_count && !bFoundIt; vei++ ) 
    {
      bFoundIt = (vertex.m_ei[vei] == edge_index);
    }
    if ( !bFoundIt )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_vi[%d]=%d but edge is not referenced in m_V[%d].m_ei[]\n",
                         evi,edge.m_vi[evi],edge.m_vi[evi] );
        text_log->PopIndent();
      }
      return false;
    }
  }

  const int edge_trim_count = edge.m_ti.Count();
  if ( edge_trim_count < 0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_ti.Count() < 0\n");
      text_log->PopIndent();
    }
    return false;
  }
  int i, eti, ti;
  for (eti = 0; eti < edge_trim_count; eti++ )
  {
    ti = edge.m_ti[eti];
    if ( ti < 0 || ti >= m_T.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_ti[%d]=%d (should be >=0 and <%d=m_T.Count())\n",eti,ti);
        text_log->PopIndent();
      }
      return false;
    }
    if ( m_T[ti].m_trim_index != ti )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_ti[%d]=%d is a deleted trim\n",eti,ti);
        text_log->PopIndent();
      }
      return false;
    }
    for ( i = 0; i < eti; i++ ) 
    {
      if ( edge.m_ti[i] == ti )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
          text_log->PushIndent();
          text_log->Print("edge.m_ti[%d]=edge.m_ti[%d]=%d (a trim should be referenced once).\n",i,eti,ti);
          text_log->PopIndent();
        }
        return false;
      }
    }
    const ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_ei != edge_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_ti[%d]=%d but brep.m_T[%d].m_ei=%d\n",eti,ti,ti,trim.m_ei);
        text_log->PopIndent();
      }
      return false;
    }
  }

  return true;
}